

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O0

void duckdb::MergeUpdateLoop<duckdb::uhugeint_t>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  UnifiedVectorFormat *in_RCX;
  uhugeint_t *update_vector_data;
  uhugeint_t *base_table_data;
  row_t *in_stack_0000a148;
  uhugeint_t *in_stack_0000a150;
  SelectionVector *in_stack_0000a158;
  UpdateInfo *in_stack_0000a160;
  uhugeint_t *in_stack_0000a168;
  UpdateInfo *in_stack_0000a170;
  idx_t in_stack_0000a180;
  SelectionVector *in_stack_0000a188;
  
  FlatVector::GetData<duckdb::uhugeint_t>((Vector *)0xbc47f1);
  UnifiedVectorFormat::GetData<duckdb::uhugeint_t>(in_RCX);
  MergeUpdateLoopInternal<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::ExtractStandardEntry>
            (in_stack_0000a170,in_stack_0000a168,in_stack_0000a160,in_stack_0000a158,
             in_stack_0000a150,in_stack_0000a148,in_stack_0000a180,in_stack_0000a188);
  return;
}

Assistant:

static void MergeUpdateLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                            UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto base_table_data = FlatVector::GetData<T>(base_data);
	auto update_vector_data = update.GetData<T>(update);
	MergeUpdateLoopInternal<T, T>(base_info, base_table_data, update_info, *update.sel, update_vector_data, ids, count,
	                              sel);
}